

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::UnaryScatter<duckdb::MinMaxState<float>,float,duckdb::MaxOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  float *pfVar2;
  long lVar3;
  MinMaxState<float> **states_00;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  float local_cc;
  idx_t local_c8;
  float local_c0;
  undefined4 uStack_bc;
  data_ptr_t local_b8;
  unsigned_long *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pfVar2 = (float *)input->data;
      states_00 = (MinMaxState<float> **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::MinMaxState<float>,float,duckdb::MaxOperation>
                (pfVar2,aggr_input_data,states_00,&input->validity,count);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    pfVar2 = *(float **)states->data;
    local_c0 = *(float *)input->data;
    if (*(char *)(pfVar2 + 1) == '\0') {
      *pfVar2 = local_c0;
      *(undefined1 *)(pfVar2 + 1) = 1;
      return;
    }
    bVar4 = GreaterThan::Operation<float>(&local_c0,pfVar2);
    if (!bVar4) {
      return;
    }
    *pfVar2 = local_c0;
    return;
  }
  local_c8 = count;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  iVar9 = local_c8;
  Vector::ToUnifiedFormat(input,local_c8,(UnifiedVectorFormat *)&local_c0);
  Vector::ToUnifiedFormat(states,iVar9,&local_78);
  if (local_b0 == (unsigned_long *)0x0) {
    if (local_c8 != 0) {
      uVar8 = 0;
      iVar9 = local_c8;
      do {
        lVar3 = *(long *)CONCAT44(uStack_bc,local_c0);
        uVar7 = uVar8;
        if (lVar3 != 0) {
          uVar7 = (ulong)*(uint *)(lVar3 + uVar8 * 4);
        }
        uVar5 = uVar8;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)(local_78.sel)->sel_vector[uVar8];
        }
        pfVar2 = *(float **)(local_78.data + uVar5 * 8);
        if (*(char *)(pfVar2 + 1) == '\0') {
          *pfVar2 = *(float *)(local_b8 + uVar7 * 4);
          *(undefined1 *)(pfVar2 + 1) = 1;
        }
        else {
          local_cc = *(float *)(local_b8 + uVar7 * 4);
          bVar4 = GreaterThan::Operation<float>(&local_cc,pfVar2);
          iVar9 = local_c8;
          if (bVar4) {
            *pfVar2 = local_cc;
          }
        }
        uVar8 = uVar8 + 1;
      } while (iVar9 != uVar8);
    }
  }
  else if (local_c8 != 0) {
    uVar7 = 0;
    uVar8 = local_c8;
    do {
      lVar3 = *(long *)CONCAT44(uStack_bc,local_c0);
      uVar5 = uVar7;
      if (lVar3 != 0) {
        uVar5 = (ulong)*(uint *)(lVar3 + uVar7 * 4);
      }
      uVar6 = uVar7;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)(local_78.sel)->sel_vector[uVar7];
      }
      if ((local_b0 == (unsigned_long *)0x0) || ((local_b0[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0))
      {
        pfVar2 = *(float **)(local_78.data + uVar6 * 8);
        if (*(char *)(pfVar2 + 1) == '\0') {
          *pfVar2 = *(float *)(local_b8 + uVar5 * 4);
          *(undefined1 *)(pfVar2 + 1) = 1;
        }
        else {
          local_cc = *(float *)(local_b8 + uVar5 * 4);
          bVar4 = GreaterThan::Operation<float>(&local_cc,pfVar2);
          uVar8 = local_c8;
          if (bVar4) {
            *pfVar2 = local_cc;
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}